

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9d_parser.c
# Opt level: O0

void adapt_prob(RK_U8 *p,RK_U32 ct0,RK_U32 ct1,RK_S32 max_count,RK_S32 update_factor)

{
  byte bVar1;
  RK_S32 RVar2;
  uint local_30;
  RK_U32 p1;
  RK_U32 p2;
  RK_U32 ct;
  RK_S32 update_factor_local;
  RK_S32 max_count_local;
  RK_U32 ct1_local;
  RK_U32 ct0_local;
  RK_U8 *p_local;
  
  local_30 = ct0 + ct1;
  if (local_30 != 0) {
    bVar1 = *p;
    RVar2 = mpp_clip((ct0 * 0x100 + (local_30 >> 1)) / local_30,1,0xff);
    if ((uint)max_count < local_30) {
      local_30 = max_count;
    }
    *p = bVar1 + (char)((RVar2 - (uint)bVar1) *
                        (int)((long)update_factor * (ulong)local_30 * (ulong)vpx_inverse[max_count]
                             >> 0x20) + 0x80 >> 8);
  }
  return;
}

Assistant:

static void adapt_prob(RK_U8 *p, RK_U32 ct0, RK_U32 ct1,
                       RK_S32 max_count, RK_S32 update_factor)
{
    RK_U32 ct = ct0 + ct1, p2, p1;

    if (!ct)
        return;

    p1 = *p;
    p2 = ((ct0 << 8) + (ct >> 1)) / ct;
    p2 = mpp_clip(p2, 1, 255);
    ct = MPP_MIN(ct, (RK_U32)max_count);
    update_factor = FASTDIV(update_factor * ct, max_count);

    // (p1 * (256 - update_factor) + p2 * update_factor + 128) >> 8
    *p = p1 + (((p2 - p1) * update_factor + 128) >> 8);
}